

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_superior_type
              (char *name,char *mod_name,lys_module *module,lys_node *parent,lys_tpdf **ret)

{
  int iVar1;
  bool bVar2;
  uint local_54;
  lys_tpdf *plStack_50;
  int tpdf_size;
  lys_tpdf *match;
  lys_tpdf *tpdf;
  int j;
  int i;
  lys_tpdf **ret_local;
  lys_node *parent_local;
  lys_module *module_local;
  char *mod_name_local;
  char *name_local;
  
  module_local = (lys_module *)mod_name;
  if (mod_name == (char *)0x0) {
    for (tpdf._4_4_ = 1; tpdf._4_4_ < 0x14; tpdf._4_4_ = tpdf._4_4_ + 1) {
      iVar1 = strcmp(ly_types[tpdf._4_4_]->name,name);
      if (iVar1 == 0) {
        if (ret != (lys_tpdf **)0x0) {
          *ret = ly_types[tpdf._4_4_];
        }
        return 0;
      }
    }
  }
  else {
    iVar1 = strcmp(mod_name,module->name);
    if (iVar1 == 0) {
      module_local = (lys_module *)0x0;
    }
  }
  if ((module_local == (lys_module *)0x0) &&
     (ret_local = (lys_tpdf **)parent, parent != (lys_node *)0x0)) {
LAB_0011ad90:
    do {
      parent_local = (lys_node *)module;
      if (ret_local == (lys_tpdf **)0x0) goto LAB_0011af5d;
      iVar1 = *(int *)(ret_local + 7);
      if (iVar1 == 1) {
        local_54 = (uint)*(ushort *)((long)ret_local + 0x1e);
        match = ret_local[0x10];
      }
      else if (iVar1 == 0x10) {
        local_54 = (uint)*(byte *)((long)ret_local + 0x1d);
        match = ret_local[0x10];
      }
      else if (iVar1 == 0x80) {
        local_54 = (uint)*(ushort *)((long)ret_local + 0x1e);
        match = ret_local[0xe];
      }
      else if (iVar1 == 0x100) {
LAB_0011ae65:
        local_54 = (uint)*(ushort *)((long)ret_local + 0x1e);
        match = ret_local[0xe];
      }
      else if ((iVar1 == 0x200) || (iVar1 == 0x400)) {
        local_54 = (uint)*(ushort *)((long)ret_local + 0x1e);
        match = ret_local[0xd];
      }
      else {
        if (iVar1 != 0x800) {
          if (iVar1 == 0x4000) goto LAB_0011ae65;
          ret_local = (lys_tpdf **)lys_parent((lys_node *)ret_local);
          goto LAB_0011ad90;
        }
        local_54 = (uint)*(ushort *)((long)ret_local + 0x1e);
        match = ret_local[0xd];
      }
      for (tpdf._4_4_ = 0; tpdf._4_4_ < (int)local_54; tpdf._4_4_ = tpdf._4_4_ + 1) {
        iVar1 = strcmp(match[tpdf._4_4_].name,name);
        if (iVar1 == 0) {
          plStack_50 = match + tpdf._4_4_;
          goto LAB_0011b0b6;
        }
      }
      ret_local = (lys_tpdf **)lys_parent((lys_node *)ret_local);
    } while( true );
  }
  parent_local = (lys_node *)lyp_get_module(module,(char *)0x0,0,(char *)module_local,0,0);
  if ((lys_module *)parent_local == (lys_module *)0x0) {
    return -1;
  }
LAB_0011af5d:
  for (tpdf._4_4_ = 0; tpdf._4_4_ < (int)(uint)*(ushort *)((long)&parent_local->child + 2);
      tpdf._4_4_ = tpdf._4_4_ + 1) {
    iVar1 = strcmp(*(char **)(parent_local[1].name + (long)tpdf._4_4_ * 0x80),name);
    if (iVar1 == 0) {
      plStack_50 = (lys_tpdf *)(parent_local[1].name + (long)tpdf._4_4_ * 0x80);
LAB_0011b0b6:
      iVar1 = resolve_superior_type_check(&plStack_50->type);
      if (iVar1 != 0) {
        return 1;
      }
      if (ret != (lys_tpdf **)0x0) {
        *ret = plStack_50;
      }
      return 0;
    }
  }
  tpdf._4_4_ = 0;
  do {
    bVar2 = false;
    if (tpdf._4_4_ < (int)(uint)*(byte *)((long)&parent_local->parent + 6)) {
      bVar2 = *(long *)(*(long *)parent_local->hash + (long)tpdf._4_4_ * 0x30) != 0;
    }
    if (!bVar2) {
      return 1;
    }
    for (tpdf._0_4_ = 0;
        (int)tpdf <
        (int)(uint)*(ushort *)
                    (*(long *)(*(long *)parent_local->hash + (long)tpdf._4_4_ * 0x30) + 0x4a);
        tpdf._0_4_ = (int)tpdf + 1) {
      iVar1 = strcmp(*(char **)(*(long *)(*(long *)(*(long *)parent_local->hash +
                                                   (long)tpdf._4_4_ * 0x30) + 0x70) +
                               (long)(int)tpdf * 0x80),name);
      if (iVar1 == 0) {
        plStack_50 = (lys_tpdf *)
                     (*(long *)(*(long *)(*(long *)parent_local->hash + (long)tpdf._4_4_ * 0x30) +
                               0x70) + (long)(int)tpdf * 0x80);
        goto LAB_0011b0b6;
      }
    }
    tpdf._4_4_ = tpdf._4_4_ + 1;
  } while( true );
}

Assistant:

int
resolve_superior_type(const char *name, const char *mod_name, const struct lys_module *module,
                      const struct lys_node *parent, struct lys_tpdf **ret)
{
    int i, j;
    struct lys_tpdf *tpdf, *match;
    int tpdf_size;

    if (!mod_name) {
        /* no prefix, try built-in types */
        for (i = 1; i < LY_DATA_TYPE_COUNT; i++) {
            if (!strcmp(ly_types[i]->name, name)) {
                if (ret) {
                    *ret = ly_types[i];
                }
                return EXIT_SUCCESS;
            }
        }
    } else {
        if (!strcmp(mod_name, module->name)) {
            /* prefix refers to the current module, ignore it */
            mod_name = NULL;
        }
    }

    if (!mod_name && parent) {
        /* search in local typedefs */
        while (parent) {
            switch (parent->nodetype) {
            case LYS_CONTAINER:
                tpdf_size = ((struct lys_node_container *)parent)->tpdf_size;
                tpdf = ((struct lys_node_container *)parent)->tpdf;
                break;

            case LYS_LIST:
                tpdf_size = ((struct lys_node_list *)parent)->tpdf_size;
                tpdf = ((struct lys_node_list *)parent)->tpdf;
                break;

            case LYS_GROUPING:
                tpdf_size = ((struct lys_node_grp *)parent)->tpdf_size;
                tpdf = ((struct lys_node_grp *)parent)->tpdf;
                break;

            case LYS_RPC:
            case LYS_ACTION:
                tpdf_size = ((struct lys_node_rpc_action *)parent)->tpdf_size;
                tpdf = ((struct lys_node_rpc_action *)parent)->tpdf;
                break;

            case LYS_NOTIF:
                tpdf_size = ((struct lys_node_notif *)parent)->tpdf_size;
                tpdf = ((struct lys_node_notif *)parent)->tpdf;
                break;

            case LYS_INPUT:
            case LYS_OUTPUT:
                tpdf_size = ((struct lys_node_inout *)parent)->tpdf_size;
                tpdf = ((struct lys_node_inout *)parent)->tpdf;
                break;

            default:
                parent = lys_parent(parent);
                continue;
            }

            for (i = 0; i < tpdf_size; i++) {
                if (!strcmp(tpdf[i].name, name)) {
                    match = &tpdf[i];
                    goto check_typedef;
                }
            }

            parent = lys_parent(parent);
        }
    } else {
        /* get module where to search */
        module = lyp_get_module(module, NULL, 0, mod_name, 0, 0);
        if (!module) {
            return -1;
        }
    }

    /* search in top level typedefs */
    for (i = 0; i < module->tpdf_size; i++) {
        if (!strcmp(module->tpdf[i].name, name)) {
            match = &module->tpdf[i];
            goto check_typedef;
        }
    }

    /* search in submodules */
    for (i = 0; i < module->inc_size && module->inc[i].submodule; i++) {
        for (j = 0; j < module->inc[i].submodule->tpdf_size; j++) {
            if (!strcmp(module->inc[i].submodule->tpdf[j].name, name)) {
                match = &module->inc[i].submodule->tpdf[j];
                goto check_typedef;
            }
        }
    }

    return EXIT_FAILURE;

check_typedef:
    if (resolve_superior_type_check(&match->type)) {
        return EXIT_FAILURE;
    }

    if (ret) {
        *ret = match;
    }
    return EXIT_SUCCESS;
}